

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::RALocalAllocator::onSaveReg
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  Error EVar9;
  undefined8 in_RAX;
  undefined7 in_register_00000031;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar10 = (uint *)CONCAT71(in_register_00000031,group);
  if (workId == 0xffffffff) {
    onSaveReg();
LAB_00123254:
    onSaveReg();
LAB_00123259:
    onSaveReg();
LAB_0012325e:
    onSaveReg();
  }
  else {
    if ((this->_curAssignment)._layout.workCount <= workId) goto LAB_00123254;
    if ((this->_curAssignment)._workToPhysMap[workId].physIds[0] != physId) goto LAB_00123259;
    if (0x1f < physId) goto LAB_0012325e;
    if (group < kPC) {
      puVar10 = (this->_curAssignment)._physToWorkIds._data[group];
      if (puVar10[physId] == workId) {
        bVar6 = (byte)physId & 0x1f;
        puVar10 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data + group;
        *puVar10 = *puVar10 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        EVar9 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this->_pass,(ulong)workId,(ulong)physId,in_RAX);
        return EVar9;
      }
      goto LAB_00123268;
    }
  }
  onSaveReg();
LAB_00123268:
  onSaveReg();
  if ((((*(uint *)&this->_pass == *puVar10) && (*(uint *)((long)&this->_pass + 4) == puVar10[1])) &&
      (uVar2 = *(uint *)&this->_cc, uVar2 == puVar10[2])) &&
     ((uVar3 = *(uint *)((long)&this->_cc + 4), uVar3 == puVar10[3] &&
      (this->_archTraits == *(ArchTraits **)(puVar10 + 4))))) {
    if ((ulong)uVar2 != 0) {
      uVar12 = 0;
      do {
        if (*(int *)(*(long *)((this->_availableRegs)._masks._data + 2) + 0x20 + uVar12 * 4) !=
            *(int *)(*(long *)(puVar10 + 8) + 0x20 + uVar12 * 4)) {
          return 0;
        }
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
    if ((ulong)uVar3 != 0) {
      uVar12 = 0;
      do {
        if (*(char *)(*(long *)(this->_availableRegs)._masks._data + uVar12) !=
            *(char *)(*(long *)(puVar10 + 6) + uVar12)) {
          return 0;
        }
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
    piVar4 = *(int **)((this->_availableRegs)._masks._data + 2);
    piVar5 = *(int **)(puVar10 + 8);
    if (*piVar4 == *piVar5) {
      uVar12 = 0xffffffffffffffff;
      do {
        if (uVar12 == 2) goto LAB_00123311;
        lVar7 = uVar12 + 2;
        uVar1 = uVar12 + 1;
        lVar8 = uVar12 + 2;
        uVar12 = uVar1;
      } while (piVar4[lVar7] == piVar5[lVar8]);
      if (2 < uVar1) {
LAB_00123311:
        uVar12 = (ulong)(uint)piVar4[4];
        if (piVar4[4] == piVar5[4]) {
          uVar1 = 0;
          do {
            uVar11 = uVar1;
            uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
            if (uVar11 == 3) {
              return (Error)uVar12;
            }
            uVar1 = uVar11 + 1;
          } while (piVar4[uVar11 + 5] == piVar5[uVar11 + 5]);
          if (2 < uVar11) {
            return (Error)uVar12;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

inline Error onSaveReg(RegGroup group, uint32_t workId, uint32_t physId) noexcept {
    ASMJIT_ASSERT(_curAssignment.workToPhysId(group, workId) == physId);
    ASMJIT_ASSERT(_curAssignment.physToWorkId(group, physId) == workId);

    _curAssignment.makeClean(group, workId, physId);
    return _pass->emitSave(workId, physId);
  }